

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableEnumFieldGenerator::GenerateMembers
          (RepeatedImmutableEnumFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  FieldDescriptor *in_RDI;
  FieldDescriptor *in_stack_00000028;
  char *in_stack_00000030;
  char *in_stack_00000038;
  Printer *in_stack_00000040;
  Printer *in_stack_00000048;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000050;
  bool in_stack_000000a3;
  FieldAccessorType in_stack_000000a4;
  FieldDescriptor *in_stack_000000a8;
  undefined4 in_stack_000000b0;
  FieldAccessorType in_stack_000000b4;
  FieldDescriptor *in_stack_000000b8;
  Printer *in_stack_000000c0;
  char *in_stack_000001d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_000001d8;
  Printer *in_stack_000001e0;
  FieldDescriptor *this_00;
  
  this_00 = in_RDI;
  io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
  PrintExtraFieldInfo(in_stack_00000050,in_stack_00000048);
  WriteFieldAccessorDocComment
            (in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,in_stack_000000b0._3_1_);
  io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
  WriteFieldAccessorDocComment
            (in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,in_stack_000000b0._3_1_);
  io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
  WriteFieldAccessorDocComment
            (in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,in_stack_000000b0._3_1_);
  io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
  FieldDescriptor::file(*(FieldDescriptor **)(in_RDI + 8));
  bVar1 = SupportUnknownEnumValue((FileDescriptor *)0x5b6089);
  if (bVar1) {
    WriteFieldEnumValueAccessorDocComment
              ((Printer *)CONCAT44(in_stack_000000b4,in_stack_000000b0),in_stack_000000a8,
               in_stack_000000a4,in_stack_000000a3);
    io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
    WriteFieldEnumValueAccessorDocComment
              ((Printer *)CONCAT44(in_stack_000000b4,in_stack_000000b0),in_stack_000000a8,
               in_stack_000000a4,in_stack_000000a3);
    io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
  }
  bVar1 = FieldDescriptor::is_packed(this_00);
  if (bVar1) {
    io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
  }
  return;
}

Assistant:

void RepeatedImmutableEnumFieldGenerator::GenerateMembers(
    io::Printer* printer) const {
  printer->Print(
      variables_,
      "private java.util.List<java.lang.Integer> $name$_;\n"
      "private static final "
      "com.google.protobuf.Internal.ListAdapter.Converter<\n"
      "    java.lang.Integer, $type$> $name$_converter_ =\n"
      "        new com.google.protobuf.Internal.ListAdapter.Converter<\n"
      "            java.lang.Integer, $type$>() {\n"
      "          public $type$ convert(java.lang.Integer from) {\n"
      "            @SuppressWarnings(\"deprecation\")\n"
      "            $type$ result = $type$.$for_number$(from);\n"
      "            return result == null ? $unknown$ : result;\n"
      "          }\n"
      "        };\n");
  PrintExtraFieldInfo(variables_, printer);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_GETTER);
  printer->Print(
      variables_,
      "$deprecation$public java.util.List<$type$> "
      "${$get$capitalized_name$List$}$() {\n"
      "  return new com.google.protobuf.Internal.ListAdapter<\n"
      "      java.lang.Integer, $type$>($name$_, $name$_converter_);\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_ADDER);
  printer->Print(
      variables_,
      "$deprecation$public int ${$get$capitalized_name$Count$}$() {\n"
      "  return $name$_.size();\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_INDEXED_GETTER);
  printer->Print(
      variables_,
      "$deprecation$public $type$ ${$get$capitalized_name$$}$(int index) {\n"
      "  return $name$_converter_.convert($name$_.get(index));\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  if (SupportUnknownEnumValue(descriptor_->file())) {
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_, LIST_GETTER);
    printer->Print(variables_,
                   "$deprecation$public java.util.List<java.lang.Integer>\n"
                   "${$get$capitalized_name$ValueList$}$() {\n"
                   "  return $name$_;\n"
                   "}\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_,
                                          LIST_INDEXED_GETTER);
    printer->Print(variables_,
                   "$deprecation$public int "
                   "${$get$capitalized_name$Value$}$(int index) {\n"
                   "  return $name$_.get(index);\n"
                   "}\n");
    printer->Annotate("{", "}", descriptor_);
  }

  if (descriptor_->is_packed()) {
    printer->Print(variables_, "private int $name$MemoizedSerializedSize;\n");
  }
}